

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int mp_snprint_ext_test(char *buf,int size,char **data,int depth)

{
  char *local_40;
  char *ext;
  char local_2d;
  uint32_t len;
  int8_t type;
  char **ppcStack_28;
  int depth_local;
  char **data_local;
  char *pcStack_18;
  int size_local;
  char *buf_local;
  
  len = depth;
  ppcStack_28 = data;
  data_local._4_4_ = size;
  pcStack_18 = buf;
  ext._4_4_ = mp_decode_extl(data,&local_2d);
  local_40 = *ppcStack_28;
  *ppcStack_28 = *ppcStack_28 + ext._4_4_;
  if (local_2d == '\0') {
    buf_local._4_4_ = snprintf(pcStack_18,(long)data_local._4_4_,"%.*s",(ulong)ext._4_4_,local_40);
  }
  else if (local_2d == '\x01') {
    buf_local._4_4_ = mp_snprint_recursion(pcStack_18,data_local._4_4_,&local_40,len);
  }
  else {
    buf_local._4_4_ = snprintf(pcStack_18,(long)data_local._4_4_,"undefined");
  }
  return buf_local._4_4_;
}

Assistant:

static int
mp_snprint_ext_test(char *buf, int size, const char **data, int depth)
{
	int8_t type;
	uint32_t len = mp_decode_extl(data, &type);
	const char *ext = *data;
	*data += len;
	switch(type) {
	case MP_EXT_TEST_PLAIN:
		return snprintf(buf, size, "%.*s", len, ext);
	case MP_EXT_TEST_MSGPACK:
		return mp_snprint_recursion(buf, size, &ext, depth);
	}
	return snprintf(buf, size, "undefined");
}